

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O2

int __thiscall ninx::lexer::Reader::ignore_spaces(Reader *this)

{
  int iVar1;
  int iVar2;
  int count;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    iVar1 = std::istream::peek();
    iVar2 = isspace(iVar1);
    if ((iVar1 == 10) || (iVar2 == 0)) break;
    std::istream::get();
    iVar3 = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int ninx::lexer::Reader::ignore_spaces() {
    int count = 0;
    int current;
    // Skip all the spaces except the newline
    while (isspace(current = this->stream.peek()) && current != '\n') {
        this->stream.get();
        count++;
    }
    return count;
}